

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_parseModelWithUnitsAndNamedComponent_Test::~Parser_parseModelWithUnitsAndNamedComponent_Test
          (Parser_parseModelWithUnitsAndNamedComponent_Test *this)

{
  Parser_parseModelWithUnitsAndNamedComponent_Test *this_local;
  
  ~Parser_parseModelWithUnitsAndNamedComponent_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseModelWithUnitsAndNamedComponent)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <units name=\"fahrenheitish\">\n"
        "    <unit multiplier=\"1.8\" units=\"kelvin\"/>\n"
        "  </units>\n"
        "  <units name=\"dimensionless\"/>\n"
        "  <component name=\"component_name\"/>\n"
        "</model>\n";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <units name=\"fahrenheitish\">\n"
        "    <unit multiplier=\"1.8\" units=\"kelvin\"/>\n"
        "  </units>\n"
        "  <component name=\"component_name\"/>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(in);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}